

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O1

bool __thiscall
gl3cts::ClipDistance::FunctionalTest::checkResults
          (FunctionalTest *this,GLenum primitive_type,GLuint clip_function,
          vector<float,_std::allocator<float>_> *results)

{
  pointer pfVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  double dVar11;
  
  lVar5 = (long)(results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar5 == 0) {
    bVar2 = false;
  }
  else {
    uVar9 = 1;
    if (primitive_type == 1) {
      dVar11 = (double)(ulong)(lVar5 >> 2);
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      uVar9 = (int)(long)dVar11 + 1;
    }
    uVar6 = (long)(results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if (primitive_type == 1) {
      dVar11 = (double)(ulong)((long)uVar6 >> 2);
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      uVar3 = (uint)(long)dVar11;
    }
    else {
      uVar3 = (uint)(uVar6 >> 2);
    }
    pfVar1 = (results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar1;
    if (lVar5 == 0) {
      fVar10 = 0.0;
    }
    else {
      fVar10 = 0.0;
      uVar6 = 0;
      uVar7 = uVar9;
      do {
        uVar8 = (ulong)uVar7;
        fVar10 = fVar10 + pfVar1[uVar6];
        uVar7 = uVar7 + uVar9;
        uVar6 = uVar8;
      } while (uVar8 < (ulong)(lVar5 >> 2));
    }
    iVar4 = (uint)(primitive_type != 1) * 4 + 4;
    if (primitive_type == 0) {
      iVar4 = 0;
    }
    bVar2 = ABS(m_expected_integral[iVar4 + clip_function] - fVar10 / (float)uVar3) <= 0.01;
  }
  return bVar2;
}

Assistant:

bool gl3cts::ClipDistance::FunctionalTest::checkResults(glw::GLenum primitive_type, glw::GLuint clip_function,
														std::vector<glw::GLfloat>& results)
{
	/* Check for errors */
	if (results.size() == 0)
	{
		return false;
	}

	/* Calculate surface/line integral */
	glw::GLfloat integral = 0.f;

	glw::GLuint increment = (glw::GLuint)((primitive_type == GL_LINES) ?
											  glw::GLuint(sqrt(glw::GLfloat(results.size()))) + 1 /* line integral */ :
											  1 /* surface integral */);
	glw::GLuint base = (glw::GLuint)((primitive_type == GL_LINES) ?
										 glw::GLuint(sqrt(glw::GLfloat(results.size()))) /* line integral */ :
										 results.size() /* surface integral */);

	for (glw::GLuint i_pixels = 0; i_pixels < results.size(); i_pixels += increment)
	{
		integral += results[i_pixels];
	}

	integral /= static_cast<glw::GLfloat>(base);

	/* Check with results' lookup table */
	glw::GLuint i_primitive_type = (primitive_type == GL_POINTS) ? 0 : ((primitive_type == GL_LINES) ? 1 : 2);

	if (fabs(m_expected_integral[i_primitive_type * m_clip_function_count + clip_function] - integral) >
		0.01 /* Precision */)
	{
		return false;
	}

	return true;
}